

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.c
# Opt level: O0

void freeVariables(void)

{
  char **ppcVar1;
  variable *__ptr;
  variable *var;
  
  while (__ptr = variables_first, variables_first != (variable *)0x0) {
    ppcVar1 = &variables_first->key;
    variables_first = variables_first->next;
    free(*ppcVar1);
    free(__ptr);
  }
  free((void *)0x0);
  return;
}

Assistant:

void freeVariables(void)
{
    struct variable *var;

    while ((var = variables_first) != NULL) {
        variables_first = variables_first->next;
        free(var->key);
        free(var);
    }

    free(variables_first);
}